

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  EntryType *pEVar3;
  EntryType *pEVar4;
  code *AllocFunc;
  size_t byteSize;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar7 [16];
  
  if (size == 0) {
    pEVar3 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::ArenaAllocator::AllocZero;
    }
    else {
      AllocFunc = Memory::ArenaAllocator::Alloc;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar9 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar9 * ZEXT816(0x18),0);
    }
    uVar5 = 0;
    pEVar3 = (EntryType *)
             new__<Memory::ArenaAllocator>
                       (byteSize,this->alloc,(offset_in_ArenaAllocator_to_subr)AllocFunc);
    uVar1 = (long)size * 0x18 - 0x18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar6 = SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar8 = (undefined4)(uVar1 / 0x180000000);
    auVar7._0_8_ = CONCAT44(uVar8,uVar6);
    auVar7._8_4_ = uVar6;
    auVar7._12_4_ = uVar8;
    auVar9 = pmovsxbq(in_XMM1,0x100);
    pEVar4 = pEVar3;
    do {
      if ((bool)(~((long)(auVar7._0_8_ >> 4 | 0x8000000000000000) <
                  (long)(uVar5 ^ 0x8000000000000000)) & 1)) {
        (pEVar4->
        super_DefaultHashedEntry<int,_Js::ModuleNameRecord,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        ).super_KeyValueEntry<int,_Js::ModuleNameRecord>.
        super_ValueEntry<Js::ModuleNameRecord,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::ModuleNameRecord>_>
        .super_KeyValueEntryDataLayout2<int,_Js::ModuleNameRecord>.value.module.ptr =
             (ModuleRecordBase *)0x0;
      }
      auVar10._8_4_ = (int)uVar5;
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = (int)(uVar5 >> 0x20);
      if ((long)((auVar10._8_8_ | auVar9._8_8_) ^ 0x8000000000000000) <=
          (long)(auVar7._8_8_ >> 4 | 0x8000000000000000)) {
        pEVar4[1].
        super_DefaultHashedEntry<int,_Js::ModuleNameRecord,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<int,_Js::ModuleNameRecord>.
        super_ValueEntry<Js::ModuleNameRecord,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::ModuleNameRecord>_>
        .super_KeyValueEntryDataLayout2<int,_Js::ModuleNameRecord>.value.module.ptr =
             (ModuleRecordBase *)0x0;
      }
      uVar5 = uVar5 + 2;
      pEVar4 = pEVar4 + 2;
    } while ((uVar1 / 0x18 + 2 & 0xfffffffffffffffe) != uVar5);
  }
  return pEVar3;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}